

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O1

_Bool Curl_pipeline_site_blacklisted(SessionHandle *handle,connectdata *conn)

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  curl_llist *pcVar4;
  bool bVar5;
  curl_llist_element *pcVar6;
  
  if ((handle->multi == (Curl_multi *)0x0) ||
     (pcVar4 = Curl_multi_pipelining_site_bl(handle->multi), pcVar4 == (curl_llist *)0x0)) {
    bVar5 = false;
  }
  else {
    pcVar6 = pcVar4->head;
    do {
      bVar5 = pcVar6 != (curl_llist_element *)0x0;
      if (pcVar6 == (curl_llist_element *)0x0) {
        return bVar5;
      }
      puVar1 = (undefined8 *)pcVar6->ptr;
      iVar3 = Curl_raw_equal((char *)*puVar1,(conn->host).name);
      if ((iVar3 == 0) || (conn->remote_port != (uint)*(ushort *)(puVar1 + 1))) {
        pcVar6 = pcVar6->next;
        bVar2 = true;
      }
      else {
        bVar2 = false;
        Curl_infof(handle,"Site %s:%d is pipeline blacklisted\n",(conn->host).name);
      }
    } while (bVar2);
  }
  return bVar5;
}

Assistant:

bool Curl_pipeline_site_blacklisted(struct SessionHandle *handle,
                                    struct connectdata *conn)
{
  if(handle->multi) {
    struct curl_llist *blacklist =
      Curl_multi_pipelining_site_bl(handle->multi);

    if(blacklist) {
      struct curl_llist_element *curr;

      curr = blacklist->head;
      while(curr) {
        struct site_blacklist_entry *site;

        site = curr->ptr;
        if(Curl_raw_equal(site->hostname, conn->host.name) &&
           site->port == conn->remote_port) {
          infof(handle, "Site %s:%d is pipeline blacklisted\n",
                conn->host.name, conn->remote_port);
          return TRUE;
        }
        curr = curr->next;
      }
    }
  }
  return FALSE;
}